

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void string64_suite::run(void)

{
  test_empty();
  test_one();
  test_two();
  fail_missing_length_one();
  fail_missing_length_two();
  fail_missing_length_three();
  fail_missing_length_four();
  fail_missing_length_five();
  fail_missing_length_six();
  fail_missing_length_seven();
  fail_missing_length_eight();
  fail_negative_length();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_one();
    test_two();
    fail_missing_length_one();
    fail_missing_length_two();
    fail_missing_length_three();
    fail_missing_length_four();
    fail_missing_length_five();
    fail_missing_length_six();
    fail_missing_length_seven();
    fail_missing_length_eight();
    fail_negative_length();
}